

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,COpExp *exp)

{
  CPrintVisitor *this_00;
  int id;
  initializer_list<INode_*> __l;
  allocator local_131;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_130;
  string operationDescription;
  ChildrenAnswers answers;
  string local_c8;
  string local_a8;
  string local_88;
  vector<INode_*,_std::allocator<INode_*>_> children;
  ChildrenAnswers local_50;
  
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(exp->leftOperand)._M_t.
                super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(exp->rightOperand)._M_t.
                super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  __l._M_len = 2;
  __l._M_array = (iterator)&answers;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&children,__l,(allocator_type *)&operationDescription);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_130,&children);
  VisitChildren(&answers,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_130);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_130);
  id = this->lastVisited + 1;
  this->lastVisited = id;
  this_00 = (CPrintVisitor *)
            std::
            map<enums::TOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TOperation>,_std::allocator<std::pair<const_enums::TOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&COpExp::stringOperations_abi_cxx11_,&exp->operation);
  std::__cxx11::string::string((string *)&local_88,(string *)this_00);
  ConstructLabel(&operationDescription,this_00,&local_88,id);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,(string *)&operationDescription);
  ChildrenAnswers::PushBack((ChildrenAnswers *)&answers,&local_a8,id);
  std::__cxx11::string::~string((string *)&local_a8);
  ChildrenAnswers::ChildrenAnswers(&local_50,&answers);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_50);
  ChildrenAnswers::~ChildrenAnswers(&local_50);
  std::__cxx11::string::string((string *)&local_c8,"OpExp",&local_131);
  AddLabel(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  this->lastVisited = this->lastVisited + 1;
  std::__cxx11::string::~string((string *)&operationDescription);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&answers);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(COpExp &exp) {
	std::vector<INode*> children = { exp.leftOperand.get(), exp.rightOperand.get() };
	ChildrenAnswers answers = VisitChildren(children);

	int operationId = ++lastVisited;
	std::string operationDescription = ConstructLabel(exp.stringOperations[exp.operation], operationId);
	answers.PushBack(operationDescription, operationId);

	AddChildrenAnswers(answers);
	AddLabel("OpExp");
	++lastVisited;
}